

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O3

void __thiscall duckdb::FSSTScanState::~FSSTScanState(FSSTScanState *this)

{
  _Head_base<0UL,_unsigned_int_*,_false> _Var1;
  pointer puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_StringScanState).super_SegmentScanState._vptr_SegmentScanState =
       (_func_int **)&PTR__FSSTScanState_01976b38;
  _Var1._M_head_impl =
       (this->delta_decode_buffer).
       super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
       super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (uint *)0x0) {
    operator_delete__(_Var1._M_head_impl);
  }
  (this->delta_decode_buffer).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
  ._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (uint *)0x0;
  _Var1._M_head_impl =
       (this->bitunpack_buffer).
       super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
       super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (uint *)0x0) {
    operator_delete__(_Var1._M_head_impl);
  }
  (this->bitunpack_buffer).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>.
  _M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (uint *)0x0;
  puVar2 = (this->decompress_buffer).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  this_00 = (this->duckdb_fsst_decoder).internal.
            super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->super_StringScanState).super_SegmentScanState._vptr_SegmentScanState =
       (_func_int **)&PTR__StringScanState_01975748;
  BufferHandle::~BufferHandle(&(this->super_StringScanState).handle);
  operator_delete(this);
  return;
}

Assistant:

explicit FSSTScanState(const idx_t string_block_limit) {
		ResetStoredDelta();
		decompress_buffer.resize(string_block_limit + 1);
	}